

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlEncodeEntities(uchar *out,int *outlen,uchar *in,int *inlen,int quoteChar)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  char *__s;
  uchar *puVar9;
  uchar *puVar10;
  byte *pbVar11;
  int iVar12;
  char nbuf [16];
  int local_68;
  int local_58;
  char local_48 [24];
  
  iVar12 = -1;
  if ((((in != (uchar *)0x0) && (out != (uchar *)0x0)) && (outlen != (int *)0x0)) &&
     (inlen != (int *)0x0)) {
    iVar2 = *inlen;
    pbVar8 = in;
    puVar9 = out;
    if ((long)iVar2 < 1) {
      iVar12 = 0;
    }
    else {
      iVar3 = *outlen;
      do {
        bVar1 = *pbVar8;
        uVar6 = (uint)bVar1;
        uVar7 = 0;
        if ((char)bVar1 < '\0') {
          iVar12 = -2;
          if (bVar1 < 0xc0) break;
          if (bVar1 < 0xe0) {
            uVar6 = bVar1 & 0x1f;
            uVar7 = 1;
          }
          else if (bVar1 < 0xf0) {
            uVar6 = bVar1 & 0xf;
            uVar7 = 2;
          }
          else {
            if (0xf7 < bVar1) break;
            uVar6 = uVar6 & 7;
            uVar7 = 3;
          }
        }
        pbVar11 = pbVar8 + 1;
        iVar12 = 0;
        if ((long)(in + iVar2) - (long)pbVar11 < (long)(ulong)uVar7) break;
        if ((char)bVar1 < '\0') {
          pbVar11 = pbVar8 + (ulong)(uVar7 - 1) + 2;
          lVar4 = 0;
          do {
            if ((pbVar8[lVar4 + 1] & 0xffffffc0) != 0x80) {
              iVar12 = -2;
              goto LAB_0014aae4;
            }
            uVar6 = pbVar8[lVar4 + 1] & 0x3f | uVar6 << 6;
            lVar4 = lVar4 + 1;
          } while (uVar7 != (uint)lVar4);
        }
        iVar12 = 0;
        if ((uVar6 < 0x80) && ((uVar6 & 0x7d) != 0x3c && (uVar6 != 0x26 && uVar6 != quoteChar))) {
          if (out + iVar3 <= puVar9) break;
          *puVar9 = (uchar)uVar6;
          puVar10 = puVar9 + 1;
        }
        else {
          lVar4 = 0;
          do {
            uVar7 = *(uint *)((long)&html40EntitiesTable[0].value + lVar4);
            if (uVar6 <= uVar7) {
              if (uVar7 <= uVar6) {
                lVar4 = (long)&html40EntitiesTable[0].value + lVar4;
                goto LAB_0014aa4b;
              }
              break;
            }
            lVar4 = lVar4 + 0x18;
          } while (lVar4 != 0x17b8);
          lVar4 = 0;
LAB_0014aa4b:
          if (lVar4 == 0) {
            __s = local_48;
            snprintf(__s,0x10,"#%u");
          }
          else {
            __s = *(char **)(lVar4 + 8);
          }
          sVar5 = strlen(__s);
          sVar5 = (size_t)(int)sVar5;
          puVar10 = puVar9 + sVar5 + 2;
          if (out + iVar3 < puVar10) break;
          *puVar9 = '&';
          memcpy(puVar9 + 1,__s,sVar5);
          puVar9[sVar5 + 1] = ';';
        }
        pbVar8 = pbVar11;
        puVar9 = puVar10;
        iVar12 = 0;
      } while (pbVar11 < in + iVar2);
    }
LAB_0014aae4:
    local_68 = (int)out;
    *outlen = (int)puVar9 - local_68;
    local_58 = (int)in;
    *inlen = (int)pbVar8 - local_58;
  }
  return iVar12;
}

Assistant:

int
htmlEncodeEntities(unsigned char* out, int *outlen,
		   const unsigned char* in, int *inlen, int quoteChar) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL))
        return(-1);
    outend = out + (*outlen);
    inend = in + (*inlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing)
	    break;

	while (trailing--) {
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if ((c < 0x80) && (c != (unsigned int) quoteChar) &&
	    (c != '&') && (c != '<') && (c != '>')) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];
	    int len;

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */
	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
		snprintf(nbuf, sizeof(nbuf), "#%u", c);
		cp = nbuf;
	    }
	    else
		cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len > outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}